

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,long>>,boost::integer_range<int>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
          *lhs,char *op,integer_range<int> *rhs)

{
  ostream *stream;
  integer_range<int> *in;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  stream = tlssPush();
  filldata<boost::iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>_>
  ::fill(stream,(iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
                 *)this);
  tlssPop();
  String::String(&local_68,(char *)lhs);
  operator+(&local_38,&local_50,&local_68);
  toStream<boost::integer_range<int>>(&local_80,(detail *)op,in);
  operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }